

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffphext(fitsfile *fptr,char *xtensionx,int bitpix,int naxis,long *naxes,LONGLONG pcount,
           LONGLONG gcount,int *status)

{
  uint in_ECX;
  char *in_RSI;
  int *in_RDI;
  long in_R8;
  int ii;
  char xtension [71];
  char name [20];
  char comm [81];
  char message [81];
  int local_15c;
  char local_158 [24];
  int *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  int *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff14;
  fitsfile *in_stack_ffffffffffffff18;
  char acStack_d4 [12];
  int *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  fitsfile *in_stack_ffffffffffffff58;
  char local_88 [96];
  long local_28;
  uint local_20;
  char *local_18;
  int *local_10;
  int local_4;
  
  local_28 = in_R8;
  local_20 = in_ECX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
    ffmahd(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,in_stack_ffffffffffffff08,
           in_stack_ffffffffffffff00);
  }
  if (*(int *)xtension._0_8_ < 1) {
    if (*(long *)(*(long *)(local_10 + 2) + 0x70) ==
        *(long *)(*(long *)(*(long *)(local_10 + 2) + 0x68) +
                 (long)*(int *)(*(long *)(local_10 + 2) + 0x54) * 8)) {
      if (((int)local_20 < 0) || (999 < (int)local_20)) {
        snprintf(local_88,0x51,"Illegal value for NAXIS keyword: %d",(ulong)local_20);
        ffpmsg((char *)0x240385);
        *(undefined4 *)xtension._0_8_ = 0xd4;
        local_4 = 0xd4;
      }
      else {
        local_158[0] = '\0';
        strncat(local_158,local_18,0x46);
        ffpkys(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        ffpkyj(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               (LONGLONG)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
        ffpkyj(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               (LONGLONG)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
        strcpy(&stack0xffffffffffffff18,"length of data axis ");
        for (local_15c = 0; local_15c < (int)local_20; local_15c = local_15c + 1) {
          if (*(long *)(local_28 + (long)local_15c * 8) < 0) {
            snprintf(local_88,0x51,"Illegal negative value for NAXIS%d keyword: %.0f",
                     (double)*(long *)(local_28 + (long)local_15c * 8),(ulong)(local_15c + 1));
            ffpmsg((char *)0x2404c0);
            *(undefined4 *)xtension._0_8_ = 0xd5;
            return 0xd5;
          }
          snprintf(acStack_d4,0x3d,"%d",(ulong)(local_15c + 1));
          ffkeyn(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffec8,
                 in_stack_fffffffffffffec0);
          ffpkyj(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 (LONGLONG)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff38);
        }
        ffpkyj(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               (LONGLONG)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
        ffpkyj(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               (LONGLONG)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
        if (0 < *(int *)xtension._0_8_) {
          ffpmsg((char *)0x2405d6);
        }
        local_4 = *(int *)xtension._0_8_;
      }
    }
    else {
      *(undefined4 *)xtension._0_8_ = 0xc9;
      local_4 = 0xc9;
    }
  }
  else {
    local_4 = *(int *)xtension._0_8_;
  }
  return local_4;
}

Assistant:

int ffphext(fitsfile *fptr,  /* I - FITS file pointer                       */
           const char *xtensionx,   /* I - value for the XTENSION keyword          */
           int bitpix,       /* I - value for the BIXPIX keyword            */
           int naxis,        /* I - value for the NAXIS keyword             */
           long naxes[],     /* I - value for the NAXISn keywords           */
           LONGLONG pcount,  /* I - value for the PCOUNT keyword            */
           LONGLONG gcount,  /* I - value for the GCOUNT keyword            */
           int *status)      /* IO - error status                           */
/*
  Put required Header keywords into a conforming extension:
*/
{
    char message[FLEN_ERRMSG],comm[81], name[20], xtension[FLEN_VALUE];
    int ii;
 
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (*status > 0)
        return(*status);
    else if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status = HEADER_NOT_EMPTY);

    if (naxis < 0 || naxis > 999)
    {
        snprintf(message,FLEN_ERRMSG,
        "Illegal value for NAXIS keyword: %d", naxis);
        ffpmsg(message);
        return(*status = BAD_NAXIS);
    }

    xtension[0] = '\0';
    strncat(xtension, xtensionx, FLEN_VALUE-1);

    ffpkys(fptr, "XTENSION", xtension, "extension type", status);
    ffpkyj(fptr, "BITPIX",   bitpix,   "number of bits per data pixel", status);
    ffpkyj(fptr, "NAXIS",    naxis,    "number of data axes", status);

    strcpy(comm, "length of data axis ");
    for (ii = 0; ii < naxis; ii++)
    {
        if (naxes[ii] < 0)
        {
            snprintf(message,FLEN_ERRMSG,
            "Illegal negative value for NAXIS%d keyword: %.0f", ii + 1, (double) (naxes[ii]));
            ffpmsg(message);
            return(*status = BAD_NAXES);
        }

        snprintf(&comm[20], 61, "%d", ii + 1);
        ffkeyn("NAXIS", ii + 1, name, status);
        ffpkyj(fptr, name, naxes[ii], comm, status);
    }


    ffpkyj(fptr, "PCOUNT", pcount, " ", status);
    ffpkyj(fptr, "GCOUNT", gcount, " ", status);

    if (*status > 0)
        ffpmsg("Failed to write extension header keywords (ffphext)");

    return(*status);
}